

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lk;
  id tid;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._M_device = (mutex_type *)std::this_thread::get_id();
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx_);
  bVar1 = std::operator==((id)(this->e_owner_)._M_thread,(id)lk._M_device);
  if ((!bVar1) && (bVar1 = is_shared_owner(this,(id)lk._M_device), !bVar1)) {
    bVar1 = rwlock::ReaderPrefer::wait_rlock(&this->state_);
    if (!bVar1) {
      rwlock::ReaderPrefer::acquire_rlock(&this->state_);
      std::vector<std::thread::id,_std::allocator<std::thread::id>_>::push_back
                (&this->s_owner_,(value_type *)&lk);
      validator::deadlock::locked((uintptr_t)this,(id)lk._M_device,true);
    }
    this_local._7_1_ = !bVar1;
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
    return this_local._7_1_;
  }
  abort();
}

Assistant:

bool try_lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock_shared");
#endif
    }
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
    return true;
  }